

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperationsExecuter.h
# Opt level: O0

bool __thiscall
Refal2::COperationsExecuter::matchLeftDuplicateSaveToTable_WV
          (COperationsExecuter *this,TTableIndex origin)

{
  CNode<Refal2::CUnit> *this_00;
  bool bVar1;
  CNode<Refal2::CUnit> *pCVar2;
  CNode<Refal2::CUnit> *pCVar3;
  CUnitNode *valueBegin;
  CUnitNode *originRight;
  CUnitNode *originLeft;
  TTableIndex origin_local;
  COperationsExecuter *this_local;
  
  originRight = this->table[origin];
  pCVar3 = this->table[origin + 1];
  this_00 = this->left;
  while( true ) {
    pCVar2 = CNode<Refal2::CUnit>::Next(pCVar3);
    if (originRight == pCVar2) {
      pCVar3 = CNode<Refal2::CUnit>::Next(this_00);
      saveToTable(this,pCVar3,this->left);
      return true;
    }
    bVar1 = shiftLeft(this);
    if ((!bVar1) ||
       (bVar1 = CUnit::IsEqualWith(&this->left->super_CUnit,&originRight->super_CUnit), !bVar1))
    break;
    originRight = CNode<Refal2::CUnit>::Next(originRight);
  }
  return false;
}

Assistant:

inline bool COperationsExecuter::matchLeftDuplicateSaveToTable_WV(
	const TTableIndex origin )
{
	CUnitNode* originLeft = table[origin];
	CUnitNode* const originRight = table[origin + 1];
	CUnitNode* valueBegin = left;
	for( ; originLeft != originRight->Next();
		originLeft = originLeft->Next() )
	{
		if( !shiftLeft() || !left->IsEqualWith( *originLeft ) ) {
			return false;
		}
	}
	saveToTable( valueBegin->Next(), left );
	return true;
}